

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  long *plVar1;
  int iVar2;
  Fts5PoslistReader *local_110;
  i64 iMin;
  Fts5PoslistReader *pFStack_100;
  int i;
  i64 iPrev;
  Fts5PoslistWriter writer;
  Fts5PoslistReader *aNew;
  sqlite3_int64 nByte;
  Fts5IndexIter *pIter;
  Fts5ExprTerm *p;
  int local_c8;
  int rc;
  int nAlloc;
  int nIter;
  Fts5PoslistReader *aIter;
  Fts5PoslistReader aStatic [4];
  int *pn_local;
  u8 **pa_local;
  Fts5Buffer *pBuf_local;
  i64 iRowid_local;
  Fts5ExprTerm *pTerm_local;
  
  _nAlloc = &aIter;
  rc = 0;
  local_c8 = 4;
  p._4_4_ = 0;
  pIter = (Fts5IndexIter *)pTerm;
  do {
    if (pIter == (Fts5IndexIter *)0x0) {
      if (rc == 1) {
        *pa = (u8 *)*_nAlloc;
        *pn = *(int *)(_nAlloc + 1);
      }
      else {
        memset(&iPrev,0,8);
        pFStack_100 = (Fts5PoslistReader *)0xffffffffffffffff;
        sqlite3Fts5BufferZero(pBuf);
        while( true ) {
          local_110 = (Fts5PoslistReader *)0x7fffffffffffffff;
          for (iMin._4_4_ = 0; iMin._4_4_ < rc; iMin._4_4_ = iMin._4_4_ + 1) {
            if (((*(char *)((long)_nAlloc + (long)iMin._4_4_ * 0x20 + 0x11) == '\0') &&
                ((_nAlloc[(long)iMin._4_4_ * 4 + 3] != pFStack_100 ||
                 (iVar2 = sqlite3Fts5PoslistReaderNext
                                    ((Fts5PoslistReader *)(_nAlloc + (long)iMin._4_4_ * 4)),
                 iVar2 == 0)))) && ((long)_nAlloc[(long)iMin._4_4_ * 4 + 3] < (long)local_110)) {
              local_110 = _nAlloc[(long)iMin._4_4_ * 4 + 3];
            }
          }
          if ((local_110 == (Fts5PoslistReader *)0x7fffffffffffffff) || (p._4_4_ != 0)) break;
          p._4_4_ = sqlite3Fts5PoslistWriterAppend(pBuf,(Fts5PoslistWriter *)&iPrev,(i64)local_110);
          pFStack_100 = local_110;
        }
        if (p._4_4_ == 0) {
          *pa = pBuf->p;
          *pn = pBuf->n;
        }
      }
LAB_001fdffd:
      if (_nAlloc != &aIter) {
        sqlite3_free(_nAlloc);
      }
      return p._4_4_;
    }
    plVar1 = *(long **)&pIter->nData;
    if (((*(char *)((long)plVar1 + 0x14) == '\0') && (*plVar1 == iRowid)) && ((int)plVar1[2] != 0))
    {
      if (rc == local_c8) {
        writer.iPrev = (i64)sqlite3_malloc64((long)local_c8 << 6);
        if ((void *)writer.iPrev == (void *)0x0) {
          p._4_4_ = 7;
          goto LAB_001fdffd;
        }
        memcpy((void *)writer.iPrev,_nAlloc,(long)rc << 5);
        local_c8 = local_c8 << 1;
        if (_nAlloc != &aIter) {
          sqlite3_free(_nAlloc);
        }
        _nAlloc = (Fts5PoslistReader **)writer.iPrev;
      }
      sqlite3Fts5PoslistReaderInit
                ((u8 *)plVar1[1],(int)plVar1[2],(Fts5PoslistReader *)(_nAlloc + (long)rc * 4));
      rc = rc + 1;
    }
    pIter = (Fts5IndexIter *)pIter[1].iRowid;
  } while( true );
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm, 
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}